

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strtod.cc
# Opt level: O3

bool __thiscall
double_conversion::ComputeGuess
          (double_conversion *this,Vector<const_char> trimmed,int exponent,double *guess)

{
  double_conversion *pdVar1;
  ulong uVar2;
  byte bVar3;
  int iVar4;
  uint uVar5;
  undefined4 in_register_0000000c;
  double *pdVar6;
  uint uVar7;
  ulong uVar8;
  long lVar9;
  uint uVar10;
  ulong uVar11;
  ulong uVar12;
  int iVar13;
  ulong uVar14;
  long in_FS_OFFSET;
  bool bVar15;
  double dVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  DiyFp diy_fp;
  int local_4c;
  DiyFp local_48;
  long local_38;
  
  pdVar6 = (double *)CONCAT44(in_register_0000000c,exponent);
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  uVar10 = (uint)trimmed.start_;
  if (uVar10 == 0) {
LAB_003e18a8:
    *pdVar6 = 0.0;
  }
  else {
    uVar5 = trimmed.length_;
    iVar13 = uVar5 + uVar10;
    if (iVar13 < 0x136) {
      if (-0x144 < iVar13) {
        if ((int)uVar10 < 0x10) {
          if (uVar5 < 0xffffffea) {
            if (0x16 < uVar5) {
              if (-1 < (int)uVar5) {
                iVar4 = uVar5 - (0xf - uVar10);
                if (iVar4 < 0x17) {
                  if ((int)uVar10 < 1) {
                    dVar16 = 0.0;
                  }
                  else {
                    uVar8 = 1;
                    uVar11 = 0;
                    do {
                      uVar11 = ((long)(char)this[uVar8 - 1] + uVar11 * 10) - 0x30;
                      if (uVar10 <= uVar8) break;
                      uVar8 = uVar8 + 1;
                    } while (uVar11 < 0x1999999999999999);
                    auVar19._8_4_ = (int)(uVar11 >> 0x20);
                    auVar19._0_8_ = uVar11;
                    auVar19._12_4_ = 0x45300000;
                    dVar16 = (auVar19._8_8_ - 1.9342813113834067e+25) +
                             ((double)CONCAT44(0x43300000,(int)uVar11) - 4503599627370496.0);
                  }
                  dVar16 = dVar16 * *(double *)(exact_powers_of_ten + (long)(int)(0xf - uVar10) * 8)
                           * *(double *)(exact_powers_of_ten + (long)iVar4 * 8);
                  goto LAB_003e1b25;
                }
              }
              if (0 < (int)uVar10) goto LAB_003e180b;
              uVar11 = 0;
              uVar8 = 0;
              goto LAB_003e183a;
            }
            if ((int)uVar10 < 1) {
              dVar16 = 0.0;
            }
            else {
              uVar8 = 1;
              uVar11 = 0;
              do {
                uVar11 = ((long)(char)this[uVar8 - 1] + uVar11 * 10) - 0x30;
                if (uVar10 <= uVar8) break;
                uVar8 = uVar8 + 1;
              } while (uVar11 < 0x1999999999999999);
              auVar18._8_4_ = (int)(uVar11 >> 0x20);
              auVar18._0_8_ = uVar11;
              auVar18._12_4_ = 0x45300000;
              dVar16 = (auVar18._8_8_ - 1.9342813113834067e+25) +
                       ((double)CONCAT44(0x43300000,(int)uVar11) - 4503599627370496.0);
            }
            dVar16 = dVar16 * *(double *)(exact_powers_of_ten + (ulong)uVar5 * 8);
          }
          else {
            if ((int)uVar10 < 1) {
              dVar16 = 0.0;
            }
            else {
              uVar8 = 1;
              uVar11 = 0;
              do {
                uVar11 = ((long)(char)this[uVar8 - 1] + uVar11 * 10) - 0x30;
                if (uVar10 <= uVar8) break;
                uVar8 = uVar8 + 1;
              } while (uVar11 < 0x1999999999999999);
              auVar17._8_4_ = (int)(uVar11 >> 0x20);
              auVar17._0_8_ = uVar11;
              auVar17._12_4_ = 0x45300000;
              dVar16 = (auVar17._8_8_ - 1.9342813113834067e+25) +
                       ((double)CONCAT44(0x43300000,(int)uVar11) - 4503599627370496.0);
            }
            dVar16 = dVar16 / *(double *)(exact_powers_of_ten + (ulong)-uVar5 * 8);
          }
LAB_003e1b25:
          *pdVar6 = dVar16;
          goto LAB_003e18af;
        }
LAB_003e180b:
        uVar11 = 0;
        uVar8 = 0;
        do {
          pdVar1 = this + uVar11;
          uVar11 = uVar11 + 1;
          uVar8 = ((long)(char)*pdVar1 + uVar8 * 10) - 0x30;
          if (uVar10 <= uVar11) break;
        } while (uVar8 < 0x1999999999999999);
LAB_003e183a:
        iVar4 = 0;
        uVar7 = (uint)uVar11;
        if (uVar7 == uVar10) {
          lVar9 = 0;
        }
        else {
          uVar8 = uVar8 + ('4' < (char)this[(int)uVar7]);
          uVar5 = iVar13 - uVar7;
          lVar9 = 4;
        }
        if (uVar8 >> 0x36 == 0) {
          iVar4 = 0;
          uVar11 = uVar8;
          do {
            uVar8 = uVar11 << 10;
            iVar4 = iVar4 + -10;
            bVar15 = uVar11 < 0x100000000000;
            uVar11 = uVar8;
          } while (bVar15);
        }
        for (; -1 < (long)uVar8; uVar8 = uVar8 * 2) {
          iVar4 = iVar4 + -1;
        }
        lVar9 = lVar9 << (-(char)iVar4 & 0x3fU);
        if (-0x15d < (int)uVar5) {
          local_48.e_ = 0;
          local_48._12_4_ = 0xaaaaaaaa;
          local_48.f_ = 0;
          local_4c = -0x55555556;
          PowersOfTenCache::GetCachedPowerForDecimalExponent(uVar5,&local_48,&local_4c);
          iVar13 = uVar5 - local_4c;
          if (iVar13 != 0) {
            uVar5 = iVar13 - 1;
            if (6 < uVar5) {
              abort();
            }
            uVar11 = (uVar8 & 0xffffffff) * *(long *)(&DAT_00583108 + (ulong)uVar5 * 8);
            iVar4 = iVar4 + *(int *)(&DAT_005830e8 + (ulong)uVar5 * 4);
            uVar8 = ((ulong)((uint)uVar11 & 0x80000000) + 0x80000000 >> 0x20) +
                    (uVar11 >> 0x20) + (uVar8 >> 0x20) * *(long *)(&DAT_00583108 + (ulong)uVar5 * 8)
            ;
            if ((int)(0x13 - uVar10) < iVar13) {
              lVar9 = lVar9 + 4;
            }
          }
          uVar12 = (local_48.f_ >> 0x20) * (uVar8 & 0xffffffff);
          uVar11 = (uVar8 >> 0x20) * (local_48.f_ & 0xffffffff);
          uVar5 = local_48.e_ + iVar4 + 0x40;
          uVar11 = ((uVar12 & 0xffffffff) +
                    (uVar11 & 0xffffffff) +
                    ((local_48.f_ & 0xffffffff) * (uVar8 & 0xffffffff) >> 0x20) + 0x80000000 >> 0x20
                   ) + (uVar12 >> 0x20) + (uVar11 >> 0x20) + (local_48.f_ >> 0x20) * (uVar8 >> 0x20)
          ;
          uVar8 = uVar11;
          uVar10 = uVar5;
          if (uVar11 < 0x40000000000000) {
            do {
              uVar8 = uVar11 << 10;
              uVar10 = uVar10 - 10;
              bVar15 = uVar11 < 0x100000000000;
              uVar11 = uVar8;
            } while (bVar15);
          }
          for (; -1 < (long)uVar8; uVar8 = uVar8 * 2) {
            uVar10 = uVar10 - 1;
          }
          uVar11 = (9 - (ulong)(lVar9 == 0)) + lVar9 << ((char)uVar5 - (char)uVar10 & 0x3fU);
          uVar5 = 0;
          if (0xfffffbce < uVar10 + 0x40) {
            uVar5 = uVar10 + 0x472;
          }
          uVar12 = 0x35;
          if ((int)uVar10 < -0x43d) {
            uVar12 = (ulong)uVar5;
          }
          iVar13 = (int)uVar12;
          if (iVar13 < 4) {
            bVar3 = (byte)(4 - iVar13);
            uVar8 = uVar8 >> (bVar3 & 0x3f);
            uVar10 = (4 - iVar13) + uVar10;
            uVar12 = (ulong)uVar10;
            uVar11 = (uVar11 >> (bVar3 & 0x3f)) + 9;
            iVar13 = 0x3c;
          }
          else {
            iVar13 = 0x40 - iVar13;
          }
          bVar3 = (byte)iVar13;
          uVar14 = (~(-1L << (bVar3 & 0x3f)) & uVar8) << 3;
          lVar9 = 8L << (bVar3 - 1 & 0x3f);
          diy_fp.f_ = (ulong)(uVar10 + iVar13);
          uVar2 = uVar11 + lVar9;
          diy_fp._8_8_ = uVar12;
          dVar16 = (double)Double::DiyFpToUint64
                                     ((Double *)
                                      (((uVar8 >> (bVar3 & 0x3f)) + 1) - (ulong)(uVar14 < uVar2)),
                                      diy_fp);
          *pdVar6 = dVar16;
          bVar15 = true;
          if ((lVar9 - uVar11 < uVar14) && (uVar14 < uVar2)) {
            bVar15 = INFINITY <= dVar16;
          }
          goto LAB_003e18b1;
        }
      }
      goto LAB_003e18a8;
    }
    *pdVar6 = INFINITY;
  }
LAB_003e18af:
  bVar15 = true;
LAB_003e18b1:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return bVar15;
}

Assistant:

static bool ComputeGuess(Vector<const char> trimmed, int exponent,
                         double* guess) {
  if (trimmed.length() == 0) {
    *guess = 0.0;
    return true;
  }
  if (exponent + trimmed.length() - 1 >= kMaxDecimalPower) {
    *guess = Double::Infinity();
    return true;
  }
  if (exponent + trimmed.length() <= kMinDecimalPower) {
    *guess = 0.0;
    return true;
  }

  if (DoubleStrtod(trimmed, exponent, guess) ||
      DiyFpStrtod(trimmed, exponent, guess)) {
    return true;
  }
  if (*guess == Double::Infinity()) {
    return true;
  }
  return false;
}